

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_storage.cpp
# Opt level: O3

void duckdb::VectorOperations::ReadFromStorage(data_ptr_t source,idx_t count,Vector *result)

{
  PhysicalType PVar1;
  data_ptr_t pdVar2;
  undefined8 uVar3;
  NotImplementedException *this;
  long lVar4;
  idx_t iVar5;
  char *ldata;
  string local_40;
  
  Vector::SetVectorType(result,FLAT_VECTOR);
  PVar1 = (result->type).physical_type_;
  switch(PVar1) {
  case BOOL:
  case INT8:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        pdVar2[iVar5] = source[iVar5];
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case UINT8:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        pdVar2[iVar5] = source[iVar5];
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case UINT16:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        *(undefined2 *)(pdVar2 + iVar5 * 2) = *(undefined2 *)(source + iVar5 * 2);
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case INT16:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        *(undefined2 *)(pdVar2 + iVar5 * 2) = *(undefined2 *)(source + iVar5 * 2);
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case UINT32:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        *(undefined4 *)(pdVar2 + iVar5 * 4) = *(undefined4 *)(source + iVar5 * 4);
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case INT32:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        *(undefined4 *)(pdVar2 + iVar5 * 4) = *(undefined4 *)(source + iVar5 * 4);
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case UINT64:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        *(undefined8 *)(pdVar2 + iVar5 * 8) = *(undefined8 *)(source + iVar5 * 8);
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case INT64:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        *(undefined8 *)(pdVar2 + iVar5 * 8) = *(undefined8 *)(source + iVar5 * 8);
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_0036c4a0_caseD_a:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unimplemented type for ReadFromStorage","");
    NotImplementedException::NotImplementedException(this,&local_40);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        *(undefined4 *)(pdVar2 + iVar5 * 4) = *(undefined4 *)(source + iVar5 * 4);
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case DOUBLE:
    if (count != 0) {
      pdVar2 = result->data;
      iVar5 = 0;
      do {
        *(undefined8 *)(pdVar2 + iVar5 * 8) = *(undefined8 *)(source + iVar5 * 8);
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    break;
  case INTERVAL:
    if (count != 0) {
      pdVar2 = result->data;
      lVar4 = 0;
      do {
        uVar3 = *(undefined8 *)(source + lVar4 + 8);
        *(undefined8 *)(pdVar2 + lVar4) = *(undefined8 *)(source + lVar4);
        *(undefined8 *)(pdVar2 + lVar4 + 8) = uVar3;
        lVar4 = lVar4 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
    break;
  default:
    if (PVar1 == UINT128) {
      if (count != 0) {
        pdVar2 = result->data;
        lVar4 = 0;
        do {
          uVar3 = *(undefined8 *)(source + lVar4 + 8);
          *(undefined8 *)(pdVar2 + lVar4) = *(undefined8 *)(source + lVar4);
          *(undefined8 *)(pdVar2 + lVar4 + 8) = uVar3;
          lVar4 = lVar4 + 0x10;
          count = count - 1;
        } while (count != 0);
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_0036c4a0_caseD_a;
      if (count != 0) {
        pdVar2 = result->data;
        lVar4 = 0;
        do {
          uVar3 = *(undefined8 *)(source + lVar4 + 8);
          *(undefined8 *)(pdVar2 + lVar4) = *(undefined8 *)(source + lVar4);
          *(undefined8 *)(pdVar2 + lVar4 + 8) = uVar3;
          lVar4 = lVar4 + 0x10;
          count = count - 1;
        } while (count != 0);
      }
    }
  }
  return;
}

Assistant:

void VectorOperations::ReadFromStorage(data_ptr_t source, idx_t count, Vector &result) {
	result.SetVectorType(VectorType::FLAT_VECTOR);
	switch (result.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		ReadFromStorageLoop<int8_t>(source, count, result);
		break;
	case PhysicalType::INT16:
		ReadFromStorageLoop<int16_t>(source, count, result);
		break;
	case PhysicalType::INT32:
		ReadFromStorageLoop<int32_t>(source, count, result);
		break;
	case PhysicalType::INT64:
		ReadFromStorageLoop<int64_t>(source, count, result);
		break;
	case PhysicalType::UINT8:
		ReadFromStorageLoop<uint8_t>(source, count, result);
		break;
	case PhysicalType::UINT16:
		ReadFromStorageLoop<uint16_t>(source, count, result);
		break;
	case PhysicalType::UINT32:
		ReadFromStorageLoop<uint32_t>(source, count, result);
		break;
	case PhysicalType::UINT64:
		ReadFromStorageLoop<uint64_t>(source, count, result);
		break;
	case PhysicalType::INT128:
		ReadFromStorageLoop<hugeint_t>(source, count, result);
		break;
	case PhysicalType::UINT128:
		ReadFromStorageLoop<uhugeint_t>(source, count, result);
		break;
	case PhysicalType::FLOAT:
		ReadFromStorageLoop<float>(source, count, result);
		break;
	case PhysicalType::DOUBLE:
		ReadFromStorageLoop<double>(source, count, result);
		break;
	case PhysicalType::INTERVAL:
		ReadFromStorageLoop<interval_t>(source, count, result);
		break;
	default:
		throw NotImplementedException("Unimplemented type for ReadFromStorage");
	}
}